

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_unres_schema_types
              (unres_schema *unres,UNRES_ITEM types,ly_ctx *ctx,int forward_ref,int print_all_errors
              ,uint32_t *resolved)

{
  UNRES_ITEM UVar1;
  int iVar2;
  LY_ERR *pLVar3;
  UNRES_ITEM *pUVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  LY_ERR local_54;
  ly_err_item *local_50;
  ly_err_item *prev_eitem;
  int_log_opts local_3c;
  int local_38;
  int_log_opts prev_ilo;
  
  prev_eitem = (ly_err_item *)ctx;
  prev_ilo = forward_ref;
  if (forward_ref != 0) {
    pLVar3 = ly_errno_glob_address();
    local_54 = *pLVar3;
    ly_ilo_change(ctx,ILO_STORE,&local_3c,&local_50);
  }
  uVar6 = (ulong)unres->count;
  local_38 = 0;
  do {
    if ((int)uVar6 == 0) goto LAB_00117953;
    uVar5 = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      if ((unres->type[uVar5] & types) != 0) {
        uVar8 = uVar8 + 1;
        iVar2 = resolve_unres_schema_item
                          (unres->module[uVar5],unres->item[uVar5],unres->type[uVar5],
                           unres->str_snode[uVar5],unres);
        pUVar4 = unres->type;
        UVar1 = pUVar4[uVar5];
        if (UVar1 == UNRES_EXT_FINALIZE) {
          pUVar4[uVar5] = UNRES_RESOLVED;
          if (iVar2 != 0) {
LAB_00117846:
            if ((prev_ilo == ILO_LOG) || (iVar2 != 1)) {
              if (print_all_errors == 0) {
                if (prev_ilo == ILO_LOG) {
                  return -1;
                }
                ly_ilo_restore((ly_ctx *)prev_eitem,local_3c,local_50,1);
                return -1;
              }
              uVar7 = uVar7 + 1;
              local_38 = -1;
            }
            else {
              ly_err_free_next((ly_ctx *)prev_eitem,local_50);
            }
            goto LAB_0011789e;
          }
        }
        else if (iVar2 == 0) {
          if (UVar1 == UNRES_LIST_UNIQ) {
            free(unres->item[uVar5]);
            pUVar4 = unres->type;
          }
        }
        else if (UVar1 != UNRES_XPATH) goto LAB_00117846;
        pUVar4[uVar5] = UNRES_RESOLVED;
        *resolved = *resolved + 1;
        uVar7 = uVar7 + 1;
      }
LAB_0011789e:
      uVar5 = uVar5 + 1;
      uVar6 = (ulong)unres->count;
    } while (uVar5 < uVar6);
  } while ((uVar7 != 0) && (uVar7 < uVar8));
  if (uVar7 < uVar8) {
    if (prev_ilo == ILO_LOG) {
      __assert_fail("forward_ref",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1cdd,
                    "int resolve_unres_schema_types(struct unres_schema *, enum UNRES_ITEM, struct ly_ctx *, int, int, uint32_t *)"
                   );
    }
    ly_ilo_restore((ly_ctx *)prev_eitem,local_3c,local_50,0);
    uVar7 = unres->count;
    iVar2 = -1;
    if (uVar7 != 0) {
      uVar6 = 0;
      do {
        if ((unres->type[uVar6] & types) != 0) {
          resolve_unres_schema_item
                    (unres->module[uVar6],unres->item[uVar6],unres->type[uVar6],
                     unres->str_snode[uVar6],unres);
          uVar7 = unres->count;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar7);
    }
  }
  else {
LAB_00117953:
    iVar2 = local_38;
    if (prev_ilo != ILO_LOG) {
      ly_ilo_restore((ly_ctx *)prev_eitem,local_3c,local_50,0);
      pLVar3 = ly_errno_glob_address();
      *pLVar3 = local_54;
      iVar2 = local_38;
    }
  }
  return iVar2;
}

Assistant:

static int
resolve_unres_schema_types(struct unres_schema *unres, enum UNRES_ITEM types, struct ly_ctx *ctx, int forward_ref,
                           int print_all_errors, uint32_t *resolved)
{
    uint32_t i, unres_count, res_count;
    int ret = 0, rc;
    struct ly_err_item *prev_eitem;
    enum int_log_opts prev_ilo;
    LY_ERR prev_ly_errno;

    /* if there can be no forward references, every failure is final, so we can print it directly */
    if (forward_ref) {
        prev_ly_errno = ly_errno;
        ly_ilo_change(ctx, ILO_STORE, &prev_ilo, &prev_eitem);
    }

    do {
        unres_count = 0;
        res_count = 0;

        for (i = 0; i < unres->count; ++i) {
            /* UNRES_TYPE_LEAFREF must be resolved (for storing leafref target pointers);
             * if-features are resolved here to make sure that we will have all if-features for
             * later check of feature circular dependency */
            if (unres->type[i] & types) {
                ++unres_count;
                rc = resolve_unres_schema_item(unres->module[i], unres->item[i], unres->type[i], unres->str_snode[i], unres);
                if (unres->type[i] == UNRES_EXT_FINALIZE) {
                    /* to avoid double free */
                    unres->type[i] = UNRES_RESOLVED;
                }
                if (!rc || (unres->type[i] == UNRES_XPATH)) {
                    /* invalid XPath can never cause an error, only a warning */
                    if (unres->type[i] == UNRES_LIST_UNIQ) {
                        /* free the allocated structure */
                        free(unres->item[i]);
                    }

                    unres->type[i] = UNRES_RESOLVED;
                    ++(*resolved);
                    ++res_count;
                } else if ((rc == EXIT_FAILURE) && forward_ref) {
                    /* forward reference, erase errors */
                    ly_err_free_next(ctx, prev_eitem);
                } else if (print_all_errors) {
                    /* just so that we quit the loop */
                    ++res_count;
                    ret = -1;
                } else {
                    if (forward_ref) {
                        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 1);
                    }
                    return -1;
                }
            }
        }
    } while (res_count && (res_count < unres_count));

    if (res_count < unres_count) {
        assert(forward_ref);
        /* just print the errors (but we must free the ones we have and get them again :-/ ) */
        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 0);

        for (i = 0; i < unres->count; ++i) {
            if (unres->type[i] & types) {
                resolve_unres_schema_item(unres->module[i], unres->item[i], unres->type[i], unres->str_snode[i], unres);
            }
        }
        return -1;
    }

    if (forward_ref) {
        /* restore log */
        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 0);
        ly_errno = prev_ly_errno;
    }

    return ret;
}